

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddWindowConv2(DdManager *table,int low,int high)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  int size;
  int *events;
  int newevent;
  int nwin;
  int res;
  int x;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  if (high - low < 1) {
    table_local._4_4_ = ddWindowConv2(table,low,high);
  }
  else {
    iVar4 = high - low;
    __ptr = malloc((long)iVar4 << 2);
    if (__ptr == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      table_local._4_4_ = 0;
    }
    else {
      for (nwin = 0; nwin < iVar4; nwin = nwin + 1) {
        *(undefined4 *)((long)__ptr + (long)nwin * 4) = 1;
      }
      newevent = table->keys - table->isolated;
      do {
        bVar2 = false;
        for (nwin = 0; iVar3 = newevent, nwin < iVar4; nwin = nwin + 1) {
          if (*(int *)((long)__ptr + (long)nwin * 4) != 0) {
            iVar5 = cuddSwapInPlace(table,nwin + low,nwin + low + 1);
            if (iVar5 == 0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              return 0;
            }
            bVar1 = newevent <= iVar5;
            newevent = iVar5;
            if ((bVar1) &&
               (newevent = cuddSwapInPlace(table,nwin + low,nwin + low + 1), newevent == 0)) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              return 0;
            }
            if (newevent < iVar3) {
              if (nwin < iVar4 + -1) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 1) * 4) = 1;
              }
              if (0 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -1) * 4) = 1;
              }
              bVar2 = true;
            }
            *(undefined4 *)((long)__ptr + (long)nwin * 4) = 0;
          }
        }
      } while (bVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      table_local._4_4_ = 1;
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
ddWindowConv2(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(ddWindowConv2(table,low,high));

    nwin = high-low;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    res = table->keys - table->isolated;
    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                size = res;
                res = cuddSwapInPlace(table,x+low,x+low+1);
                if (res == 0) {
                    ABC_FREE(events);
                    return(0);
                }
                if (res >= size) { /* no improvement: undo permutation */
                    res = cuddSwapInPlace(table,x+low,x+low+1);
                    if (res == 0) {
                        ABC_FREE(events);
                        return(0);
                    }
                }
                if (res < size) {
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res < size) {
                    (void) fprintf(table->out,"-");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}